

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3tokConnectMethod
              (sqlite3 *db,void *pHash,int argc,char **argv,sqlite3_vtab **ppVtab,char **pzErr)

{
  int argc_00;
  int local_8c;
  char **azArg;
  char *zModule;
  char **ppcStack_68;
  int nDequote;
  char **azDequote;
  _func_int_sqlite3_tokenizer_cursor_ptr *p_Stack_58;
  int rc;
  sqlite3_tokenizer *pTok;
  sqlite3_tokenizer_module *pMod;
  Fts3tokTable *pTab;
  char **pzErr_local;
  sqlite3_vtab **ppVtab_local;
  char **argv_local;
  Fts3Hash *pFStack_20;
  int argc_local;
  void *pHash_local;
  sqlite3 *db_local;
  
  pMod = (sqlite3_tokenizer_module *)0x0;
  pTok = (sqlite3_tokenizer *)0x0;
  p_Stack_58 = (_func_int_sqlite3_tokenizer_cursor_ptr *)0x0;
  ppcStack_68 = (char **)0x0;
  pTab = (Fts3tokTable *)pzErr;
  pzErr_local = (char **)ppVtab;
  ppVtab_local = (sqlite3_vtab **)argv;
  argv_local._4_4_ = argc;
  pFStack_20 = (Fts3Hash *)pHash;
  pHash_local = db;
  azDequote._4_4_ = sqlite3_declare_vtab(db,"CREATE TABLE x(input, token, start, end, position)");
  local_8c = argv_local._4_4_;
  db_local._4_4_ = azDequote._4_4_;
  if (azDequote._4_4_ == 0) {
    argc_00 = argv_local._4_4_ + -3;
    azDequote._4_4_ =
         fts3tokDequoteArray(argc_00,(char **)(ppVtab_local + 3),&stack0xffffffffffffff98);
    if (azDequote._4_4_ == 0) {
      if (argc_00 < 1) {
        azArg = (char **)anon_var_dwarf_1b56d;
      }
      else {
        azArg = (char **)*ppcStack_68;
      }
      azDequote._4_4_ =
           fts3tokQueryTokenizer
                     (pFStack_20,(char *)azArg,(sqlite3_tokenizer_module **)&pTok,(char **)pTab);
    }
    if (azDequote._4_4_ == 0) {
      if (argc_00 < 2) {
        local_8c = 0;
      }
      else {
        local_8c = local_8c + -4;
      }
      azDequote._4_4_ =
           (*(code *)pTok[1].pModule)(local_8c,ppcStack_68 + 1,&stack0xffffffffffffffa8);
    }
    if ((azDequote._4_4_ == 0) &&
       (pMod = (sqlite3_tokenizer_module *)sqlite3_malloc(0x28),
       pMod == (sqlite3_tokenizer_module *)0x0)) {
      azDequote._4_4_ = 7;
    }
    if (azDequote._4_4_ == 0) {
      memset(pMod,0,0x28);
      pMod->xOpen = (_func_int_sqlite3_tokenizer_ptr_char_ptr_int_sqlite3_tokenizer_cursor_ptr_ptr *
                    )pTok;
      pMod->xClose = p_Stack_58;
      *pzErr_local = (char *)pMod;
    }
    else if (p_Stack_58 != (_func_int_sqlite3_tokenizer_cursor_ptr *)0x0) {
      (*(code *)pTok[2].pModule)(p_Stack_58);
    }
    sqlite3_free(ppcStack_68);
    db_local._4_4_ = azDequote._4_4_;
  }
  return db_local._4_4_;
}

Assistant:

static int fts3tokConnectMethod(
  sqlite3 *db,                    /* Database connection */
  void *pHash,                    /* Hash table of tokenizers */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVtab,          /* OUT: New sqlite3_vtab object */
  char **pzErr                    /* OUT: sqlite3_malloc'd error message */
){
  Fts3tokTable *pTab = 0;
  const sqlite3_tokenizer_module *pMod = 0;
  sqlite3_tokenizer *pTok = 0;
  int rc;
  char **azDequote = 0;
  int nDequote;

  rc = sqlite3_declare_vtab(db, FTS3_TOK_SCHEMA);
  if( rc!=SQLITE_OK ) return rc;

  nDequote = argc-3;
  rc = fts3tokDequoteArray(nDequote, &argv[3], &azDequote);

  if( rc==SQLITE_OK ){
    const char *zModule;
    if( nDequote<1 ){
      zModule = "simple";
    }else{
      zModule = azDequote[0];
    }
    rc = fts3tokQueryTokenizer((Fts3Hash*)pHash, zModule, &pMod, pzErr);
  }

  assert( (rc==SQLITE_OK)==(pMod!=0) );
  if( rc==SQLITE_OK ){
    const char * const *azArg = (const char * const *)&azDequote[1];
    rc = pMod->xCreate((nDequote>1 ? nDequote-1 : 0), azArg, &pTok);
  }

  if( rc==SQLITE_OK ){
    pTab = (Fts3tokTable *)sqlite3_malloc(sizeof(Fts3tokTable));
    if( pTab==0 ){
      rc = SQLITE_NOMEM;
    }
  }

  if( rc==SQLITE_OK ){
    memset(pTab, 0, sizeof(Fts3tokTable));
    pTab->pMod = pMod;
    pTab->pTok = pTok;
    *ppVtab = &pTab->base;
  }else{
    if( pTok ){
      pMod->xDestroy(pTok);
    }
  }

  sqlite3_free(azDequote);
  return rc;
}